

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarseparator.cpp
# Opt level: O3

QSize __thiscall QToolBarSeparator::sizeHint(QToolBarSeparator *this)

{
  QStyle *pQVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QStyleOption opt;
  undefined1 local_58 [16];
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  QPalettePrivate *pQStack_30;
  undefined1 *local_28;
  QObject *pQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_30 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_58,1,0);
  QStyleOption::initFrom((QStyleOption *)local_58,(QWidget *)this);
  if (*(int *)(this + 0x28) == 1) {
    local_58._8_8_ = local_58._8_8_ | 0x80;
  }
  pQVar1 = QWidget::style((QWidget *)this);
  QVar2.wd.m_i = (**(code **)(*(long *)pQVar1 + 0xe0))
                           (pQVar1,0x38,local_58,*(undefined8 *)(*(long *)(this + 8) + 0x10));
  QStyleOption::~QStyleOption((QStyleOption *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar2.ht.m_i = QVar2.wd.m_i;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarSeparator::sizeHint() const
{
    QStyleOption opt;
    initStyleOption(&opt);
    const int extent = style()->pixelMetric(QStyle::PM_ToolBarSeparatorExtent, &opt, parentWidget());
    return QSize(extent, extent);
}